

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCutPool.h
# Opt level: O0

void __thiscall
HighsCutPool::HighsCutPool(HighsCutPool *this,HighsInt ncols,HighsInt agelim,HighsInt softlimit)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  int in_ESI;
  long in_RDI;
  size_type __new_size;
  vector<int,_std::allocator<int>_> *this_00;
  HighsDynamicRowMatrix *unaff_retaddr;
  
  HighsDynamicRowMatrix::HighsDynamicRowMatrix(unaff_retaddr,(HighsInt)((ulong)in_RDI >> 0x20));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x61948e);
  std::vector<short,_std::allocator<short>_>::vector
            ((vector<short,_std::allocator<short>_> *)0x6194a4);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x6194ba);
  __new_size = in_RDI + 0x198;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x6194d0);
  this_00 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x1b0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x6194e6);
  std::
  unordered_multimap<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
  ::unordered_multimap
            ((unordered_multimap<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
              *)0x6194fc);
  std::vector<HighsDomain::CutpoolPropagation_*,_std::allocator<HighsDomain::CutpoolPropagation_*>_>
  ::vector((vector<HighsDomain::CutpoolPropagation_*,_std::allocator<HighsDomain::CutpoolPropagation_*>_>
            *)0x619512);
  std::
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>::
  set((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
       *)0x619528);
  *(undefined4 *)(in_RDI + 0x260) = in_EDX;
  *(undefined4 *)(in_RDI + 0x264) = in_ECX;
  *(undefined4 *)(in_RDI + 0x268) = 0;
  *(undefined4 *)(in_RDI + 0x26c) = 0;
  *(undefined4 *)(in_RDI + 0x270) = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x619570);
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
            ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x619586);
  std::vector<int,_std::allocator<int>_>::resize(this_00,__new_size);
  *(undefined8 *)(in_RDI + 0x250) = 0x3feccccccccccccd;
  *(undefined8 *)(in_RDI + 0x248) = 0;
  *(double *)(in_RDI + 600) = (double)in_ESI * 0.1;
  return;
}

Assistant:

HighsCutPool(HighsInt ncols, HighsInt agelim, HighsInt softlimit)
      : matrix_(ncols),
        agelim_(agelim),
        softlimit_(softlimit),
        numLpCuts(0),
        numPropNzs(0),
        numPropRows(0) {
    ageDistribution.resize(agelim_ + 1);
    minScoreFactor = 0.9;
    bestObservedScore = 0.0;
    minDensityLim = 0.1 * ncols;
  }